

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall
rsg::ValueScope::setValue(ValueScope *this,Variable *variable,ConstValueRangeAccess value)

{
  ConstStridedValueAccess<1> local_98;
  ConstValueAccess local_88;
  StridedValueRead<1> local_78;
  ConstStridedValueAccess<1> local_68;
  ConstValueAccess local_58;
  StridedValueRead<1> local_48;
  undefined1 local_38 [8];
  ValueRangeAccess dst;
  ValueEntry *entry;
  Variable *variable_local;
  ValueScope *this_local;
  
  dst.super_ConstValueRangeAccess.m_max = (Scalar *)findEntry(this,variable);
  ValueEntry::getValueRange
            ((ValueRangeAccess *)local_38,(ValueEntry *)dst.super_ConstValueRangeAccess.m_max);
  local_58 = ConstValueRangeAccess::getMin(&value);
  local_48 = ConstStridedValueAccess<1>::value(&local_58);
  local_68 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_38);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_68,&local_48);
  local_88 = ConstValueRangeAccess::getMax(&value);
  local_78 = ConstStridedValueAccess<1>::value(&local_88);
  local_98 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_38);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_98,&local_78);
  return;
}

Assistant:

void ValueScope::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueEntry* entry = findEntry(variable);
	DE_ASSERT(entry);

	ValueRangeAccess dst = entry->getValueRange();
	dst.getMin() = value.getMin().value();
	dst.getMax() = value.getMax().value();
}